

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::Curve::readFrom(Curve *this,BinaryReader *binary)

{
  Shape *in_RSI;
  BinaryReader *in_RDI;
  BinaryReader *unaff_retaddr;
  BinaryReader *vt;
  
  vt = in_RDI;
  Shape::readFrom(in_RSI,in_RDI);
  BinaryReader::read<float,void>((BinaryReader *)in_RSI,(float *)in_RDI);
  BinaryReader::read<float,void>((BinaryReader *)in_RSI,(float *)in_RDI);
  BinaryReader::read<pbrt::Curve::BasisType,void>((BinaryReader *)in_RSI,(BasisType *)in_RDI);
  BinaryReader::read<pbrt::Curve::CurveType,void>((BinaryReader *)in_RSI,(CurveType *)in_RDI);
  BinaryReader::read<unsigned_char,void>((BinaryReader *)in_RSI,(uchar *)in_RDI);
  BinaryReader::read<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>,void>
            (unaff_retaddr,(vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)vt);
  BinaryReader::read<pbrt::math::affine3f,void>((BinaryReader *)in_RSI,(affine3f *)in_RDI);
  return;
}

Assistant:

void Curve::readFrom(BinaryReader &binary) 
  {
    Shape::readFrom(binary);
    binary.read(width0);
    binary.read(width1);
    binary.read(basis);
    binary.read(type);
    binary.read(degree);
    binary.read(P);
    binary.read(transform);
  }